

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::TraceInterpreterExecutionMode(FunctionBody *this)

{
  uint sourceContextId;
  code *pcVar1;
  bool bVar2;
  ExecutionMode EVar3;
  undefined4 *puVar4;
  
  FunctionExecutionStateMachine::AssertIsInitialized(&this->executionState);
  sourceContextId =
       ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->m_srcInfo
          ).ptr)->sourceContextInfo).ptr)->sourceContextId;
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,ExecutionModePhase,sourceContextId,
                            ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                            ptr)->functionId);
  if (bVar2) {
    EVar3 = FunctionExecutionStateMachine::GetExecutionMode(&this->executionState);
    if (EVar3 < SimpleJit) {
      DoTraceExecutionMode(this,(char *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void FunctionBody::TraceInterpreterExecutionMode() const
    {
        executionState.AssertIsInitialized();

        if(!PHASE_TRACE(Phase::ExecutionModePhase, this))
        {
            return;
        }

        switch(GetExecutionMode())
        {
            case ExecutionMode::Interpreter:
            case ExecutionMode::AutoProfilingInterpreter:
            case ExecutionMode::ProfilingInterpreter:
                DoTraceExecutionMode(nullptr);
                break;
        }
    }